

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

TRef lj_ir_k64(jit_State *J,IROp op,uint64_t u64)

{
  IRIns *pIVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar3 = 0x15;
  if (op == IR_KNUM) {
    iVar3 = 0xe;
  }
  pIVar1 = (J->cur).ir;
  for (uVar2 = J->chain[op]; uVar2 != 0; uVar2 = *(ushort *)((long)pIVar1 + (ulong)uVar2 * 8 + 6)) {
    uVar4 = (uint)uVar2;
    if (pIVar1[(ulong)uVar2 + 1] == (IRIns)u64) goto LAB_0013f461;
  }
  uVar4 = (J->cur).nk - 2;
  uVar5 = (ulong)uVar4;
  if (uVar4 < J->irbotlim) {
    lj_ir_growbot(J);
    pIVar1 = (J->cur).ir;
  }
  (J->cur).nk = uVar4;
  pIVar1[uVar5 + 1] = (IRIns)u64;
  *(char *)((long)pIVar1 + uVar5 * 8 + 4) = (char)iVar3;
  *(char *)((long)pIVar1 + uVar5 * 8 + 5) = (char)op;
  pIVar1[uVar5].field_1.op12 = 0;
  *(IRRef1 *)((long)pIVar1 + uVar5 * 8 + 6) = J->chain[op];
  J->chain[op] = (IRRef1)uVar4;
LAB_0013f461:
  return iVar3 * 0x1000000 + uVar4;
}

Assistant:

TRef lj_ir_k64(jit_State *J, IROp op, uint64_t u64)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  IRType t = op == IR_KNUM ? IRT_NUM : IRT_I64;
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_k64(&cir[ref])->u64 == u64)
      goto found;
  ref = ir_nextk64(J);
  ir = IR(ref);
  ir[1].tv.u64 = u64;
  ir->t.irt = t;
  ir->o = op;
  ir->op12 = 0;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, t);
}